

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_shared_object.hpp
# Opt level: O2

type boost::make_shared<std::ofstream>(void)

{
  undefined1 *puVar1;
  shared_count extraout_RDX;
  element_type *in_RDI;
  type tVar2;
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> pt;
  shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> sStack_28;
  
  shared_ptr<std::ofstream>::
  shared_ptr<std::ofstream,boost::detail::sp_inplace_tag<boost::detail::sp_ms_deleter<std::ofstream>>>
            ((shared_ptr<std::ofstream> *)&sStack_28,0);
  puVar1 = (undefined1 *)
           shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::
           _internal_get_untyped_deleter(&sStack_28);
  std::ofstream::ofstream((ofstream *)(puVar1 + 8));
  *puVar1 = 1;
  *(ofstream **)in_RDI = (ofstream *)(puVar1 + 8);
  *(sp_counted_base **)(in_RDI + 8) = sStack_28.pn.pi_;
  if (sStack_28.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (sStack_28.pn.pi_)->use_count_ = (sStack_28.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  detail::shared_count::~shared_count(&sStack_28.pn);
  tVar2.pn.pi_ = extraout_RDX.pi_;
  tVar2.px = in_RDI;
  return tVar2;
}

Assistant:

typename boost::detail::sp_if_not_array< T >::type make_shared( Args && ... args )
{
    boost::shared_ptr< T > pt( static_cast< T* >( 0 ), BOOST_SP_MSD( T ) );

    boost::detail::sp_ms_deleter< T > * pd = static_cast<boost::detail::sp_ms_deleter< T > *>( pt._internal_get_untyped_deleter() );

    void * pv = pd->address();

    ::new( pv ) T( boost::detail::sp_forward<Args>( args )... );
    pd->set_initialized();

    T * pt2 = static_cast< T* >( pv );

    boost::detail::sp_enable_shared_from_this( &pt, pt2, pt2 );
    return boost::shared_ptr< T >( pt, pt2 );
}